

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

bool __thiscall QAccessibleTableHeaderCell::isValid(QAccessibleTableHeaderCell *this)

{
  int iVar1;
  Data *pDVar2;
  int iVar3;
  QWidgetPrivate *pQVar4;
  QAbstractItemModel *pQVar5;
  QWidget *widget;
  QWidget *pQVar6;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->view).wp.d;
  if ((pDVar2 != (Data *)0x0) &&
     (widget = (QWidget *)(this->view).wp.value,
     widget != (QWidget *)0x0 && *(int *)(pDVar2 + 4) != 0)) {
    pQVar6 = (QWidget *)0x0;
    if (*(int *)(pDVar2 + 4) == 0) {
      widget = pQVar6;
    }
    pQVar4 = qt_widget_private(widget);
    if (((pQVar4->data).field_0x12 & 4) != 0) goto LAB_0052c344;
    pQVar5 = QAbstractItemView::model((QAbstractItemView *)(this->view).wp.value);
    if (pQVar5 != (QAbstractItemModel *)0x0) {
      local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::rootIndex
                ((QModelIndex *)&local_38,(QAbstractItemView *)(this->view).wp.value);
      iVar1 = this->index;
      if (-1 < iVar1) {
        iVar3 = (**(code **)(*(long *)pQVar5 + 0x78 + (ulong)(this->orientation == Horizontal) * 8))
                          (pQVar5,&local_38);
        pQVar6 = (QWidget *)(ulong)(iVar1 < iVar3);
        goto LAB_0052c344;
      }
    }
  }
  pQVar6 = (QWidget *)0x0;
LAB_0052c344:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return SUB81(pQVar6,0);
  }
  __stack_chk_fail();
}

Assistant:

bool QAccessibleTableHeaderCell::isValid() const
{
    const QAbstractItemModel *theModel = view && !qt_widget_private(view)->data.in_destructor
                                       ? view->model() : nullptr;
    if (!theModel)
        return false;
    const QModelIndex rootIndex = view->rootIndex();
    return (index >= 0) && ((orientation == Qt::Horizontal)
                        ? (index < theModel->columnCount(rootIndex))
                        : (index < theModel->rowCount(rootIndex)));
}